

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<long_double>::Subst_Forward(TPZMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  TPZBaseMatrix *pTVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  int64_t i;
  longdouble sum;
  int64_t c;
  longdouble pivot;
  int64_t r;
  longdouble local_78;
  long local_60;
  longdouble local_58;
  long local_40;
  longdouble local_38;
  long local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar2 == lVar3) && ((char)in_RDI[3] != '\0')) && ((char)in_RDI[3] == '\x03')) {
    local_20 = 0;
    while( true ) {
      lVar3 = local_20;
      lVar4 = (**(code **)(*in_RDI + 0x60))();
      if (lVar4 <= lVar3) break;
      (**(code **)(*in_RDI + 0x120))(in_RDI,local_20);
      local_40 = 0;
      lVar5 = in_ST7;
      local_38 = in_ST0;
      while( true ) {
        lVar3 = local_40;
        iVar2 = TPZBaseMatrix::Cols(local_18);
        if (iVar2 <= lVar3) break;
        local_58 = (longdouble)0;
        lVar5 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        for (local_60 = 0; pTVar1 = local_18, lVar4 = local_20, lVar3 = local_40,
            local_60 < local_20; local_60 = local_60 + 1) {
          (**(code **)(*in_RDI + 0x120))(in_RDI,local_20,local_60);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_60,local_40);
          local_58 = local_58 + lVar5 * in_ST1;
          lVar5 = in_ST2;
          in_ST1 = in_ST3;
          in_ST2 = in_ST4;
          in_ST3 = in_ST5;
          in_ST4 = in_ST6;
          in_ST5 = in_ST6;
        }
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])();
        local_78 = (lVar5 - local_58) / local_38;
        in_ST7 = in_ST6;
        lVar5 = in_ST6;
        (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar1,lVar4,lVar3,&local_78);
        local_40 = local_40 + 1;
      }
      local_20 = local_20 + 1;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = in_ST7;
      in_ST7 = lVar5;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}